

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
local_mbox_template<>
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this,
          mbox_id_t id)

{
  mbox_id_t id_local;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  abstract_message_box_t::abstract_message_box_t(&this->super_abstract_message_box_t);
  local_mbox_details::data_t::data_t(&this->super_data_t,id);
  (this->super_abstract_message_box_t)._vptr_abstract_message_box_t =
       (_func_int **)&PTR__local_mbox_template_005c1b40;
  return;
}

Assistant:

local_mbox_template(
			//! ID of this mbox.
			mbox_id_t id,
			//! Optional parameters for TRACING_BASE's constructor.
			TRACING_ARGS &&... args )
			:	local_mbox_details::data_t{ id }
			,	TRACING_BASE{ std::forward< TRACING_ARGS >(args)... }
			{}